

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::fuzzyCompare(TestLog *log,char *imageSetName,char *imageSetDesc,
                      ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
                      float threshold,CompareLogMode logMode)

{
  bool bVar1;
  bool bVar2;
  int width;
  int height;
  TextureFormat *pTVar3;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  bool local_7a2;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  LogImage local_708;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  LogImageSet local_628;
  TextureFormat local_5e8;
  ConstPixelBufferAccess local_5e0;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogImage local_568;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  LogImage local_488;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  LogImage local_3a8;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  LogImageSet local_2c8;
  MessageBuilder local_288;
  TextureFormat local_108;
  TextureFormat local_100;
  PixelBufferAccess local_f8;
  undefined1 local_d0 [8];
  Vec4 pixelScale;
  Vec4 pixelBias;
  bool isOk;
  PixelBufferAccess local_a0;
  float local_74;
  float difference;
  undefined1 local_68 [8];
  TextureLevel errorMask;
  FuzzyCompareParams params;
  CompareLogMode logMode_local;
  float threshold_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  params.maxSampleSkip = (int)threshold;
  FuzzyCompareParams::FuzzyCompareParams
            ((FuzzyCompareParams *)((long)&errorMask.m_data.m_cap + 4),8);
  TextureFormat::TextureFormat((TextureFormat *)&stack0xffffffffffffff90,RGB,UNORM_INT8);
  width = ConstPixelBufferAccess::getWidth(reference);
  height = ConstPixelBufferAccess::getHeight(reference);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_68,(TextureFormat *)&stack0xffffffffffffff90,width,height,1);
  TextureLevel::getAccess(&local_a0,(TextureLevel *)local_68);
  local_74 = fuzzyCompare((FuzzyCompareParams *)((long)&errorMask.m_data.m_cap + 4),reference,result
                          ,&local_a0);
  bVar1 = local_74 <= (float)params.maxSampleSkip;
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)local_d0,1.0,1.0,1.0,1.0);
  if ((bVar1) && (logMode != COMPARE_LOG_EVERYTHING)) {
    if (logMode == COMPARE_LOG_RESULT) {
      pTVar3 = ConstPixelBufferAccess::getFormat(result);
      TextureFormat::TextureFormat(&local_5e8,RGBA,UNORM_INT8);
      bVar2 = TextureFormat::operator!=(pTVar3,&local_5e8);
      if (bVar2) {
        computePixelScaleBias(result,(Vec4 *)local_d0,(Vec4 *)(pixelScale.m_data + 2));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_648,imageSetName,&local_649);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_670,imageSetDesc,&local_671);
      LogImageSet::LogImageSet(&local_628,&local_648,&local_670);
      pTVar5 = TestLog::operator<<(log,&local_628);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"Result",&local_729);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"Result",&local_751);
      LogImage::LogImage(&local_708,&local_728,&local_750,result,(Vec4 *)local_d0,
                         (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar5 = TestLog::operator<<(pTVar5,&local_708);
      TestLog::operator<<(pTVar5,(EndImageSetToken *)&TestLog::EndImageSet);
      LogImage::~LogImage(&local_708);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator(&local_751);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_729);
      LogImageSet::~LogImageSet(&local_628);
      std::__cxx11::string::~string((string *)&local_670);
      std::allocator<char>::~allocator(&local_671);
      std::__cxx11::string::~string((string *)&local_648);
      std::allocator<char>::~allocator(&local_649);
    }
  }
  else {
    errorMask.m_data.m_cap._4_4_ = 0;
    TextureLevel::getAccess(&local_f8,(TextureLevel *)local_68);
    fuzzyCompare((FuzzyCompareParams *)((long)&errorMask.m_data.m_cap + 4),reference,result,
                 &local_f8);
    pTVar3 = ConstPixelBufferAccess::getFormat(result);
    TextureFormat::TextureFormat(&local_100,RGBA,UNORM_INT8);
    bVar2 = TextureFormat::operator!=(pTVar3,&local_100);
    local_7a2 = false;
    if (bVar2) {
      pTVar3 = ConstPixelBufferAccess::getFormat(reference);
      TextureFormat::TextureFormat(&local_108,RGBA,UNORM_INT8);
      local_7a2 = TextureFormat::operator!=(pTVar3,&local_108);
    }
    if (local_7a2 != false) {
      anon_unknown_47::computeScaleAndBias
                (reference,result,(Vec4 *)local_d0,(Vec4 *)(pixelScale.m_data + 2));
    }
    if (!bVar1) {
      TestLog::operator<<(&local_288,log,(BeginMessageToken *)&TestLog::Message);
      pMVar4 = MessageBuilder::operator<<
                         (&local_288,(char (*) [39])"Image comparison failed: difference = ");
      pMVar4 = MessageBuilder::operator<<(pMVar4,&local_74);
      pMVar4 = MessageBuilder::operator<<(pMVar4,(char (*) [15])0x13c0da5);
      pMVar4 = MessageBuilder::operator<<(pMVar4,(float *)&params);
      MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&TestLog::EndMessage);
      MessageBuilder::~MessageBuilder(&local_288);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,imageSetName,&local_2e9)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,imageSetDesc,&local_311)
    ;
    LogImageSet::LogImageSet(&local_2c8,&local_2e8,&local_310);
    pTVar5 = TestLog::operator<<(log,&local_2c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Result",&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Result",&local_3f1);
    LogImage::LogImage(&local_3a8,&local_3c8,&local_3f0,result,(Vec4 *)local_d0,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = TestLog::operator<<(pTVar5,&local_3a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"Reference",&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"Reference",&local_4d1);
    LogImage::LogImage(&local_488,&local_4a8,&local_4d0,reference,(Vec4 *)local_d0,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = TestLog::operator<<(pTVar5,&local_488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"ErrorMask",&local_589);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"Error mask",&local_5b1)
    ;
    ConstPixelBufferAccess::ConstPixelBufferAccess(&local_5e0,(TextureLevel *)local_68);
    LogImage::LogImage(&local_568,&local_588,&local_5b0,&local_5e0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = TestLog::operator<<(pTVar5,&local_568);
    TestLog::operator<<(pTVar5,(EndImageSetToken *)&TestLog::EndImageSet);
    LogImage::~LogImage(&local_568);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
    LogImage::~LogImage(&local_488);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    LogImage::~LogImage(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    LogImageSet::~LogImageSet(&local_2c8);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
  }
  TextureLevel::~TextureLevel((TextureLevel *)local_68);
  return bVar1;
}

Assistant:

bool fuzzyCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, float threshold, CompareLogMode logMode)
{
	FuzzyCompareParams	params;		// Use defaults.
	TextureLevel		errorMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	float				difference		= fuzzyCompare(params, reference, result, errorMask.getAccess());
	bool				isOk			= difference <= threshold;
	Vec4				pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (!isOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// Generate more accurate error mask.
		params.maxSampleSkip = 0;
		fuzzyCompare(params, reference, result, errorMask.getAccess());

		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		if (!isOk)
			log << TestLog::Message << "Image comparison failed: difference = " << difference << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result, pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return isOk;
}